

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  pointer pcVar1;
  cmCommand *this_00;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  mode_t permissions_00;
  unsigned_long dindex;
  Directory dir;
  string toPath;
  mode_t permissions;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  ostringstream e;
  Directory DStack_1e8;
  string local_1e0;
  mode_t local_1c0;
  uint local_1bc;
  mode_t *local_1b8;
  mode_t local_1ac;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  bVar2 = cmsys::SystemTools::FileIsDirectory(destination);
  (*this->_vptr_cmFileCopier[4])(this,destination,1,(ulong)!bVar2);
  local_1b8 = &local_1ac;
  local_1ac = 0;
  bVar2 = GetDefaultDirectoryPermissions(this,&local_1b8);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::MakeDirectory(destination,local_1b8);
    if (bVar2) {
      local_1c0 = match_properties.Permissions;
      if ((ulong)match_properties >> 0x20 == 0) {
        local_1c0 = this->DirPermissions;
      }
      if (local_1c0 == 0) {
        cmsys::SystemTools::GetPermissions(source,&local_1c0);
      }
      permissions_00 = local_1c0 | 0x1c0;
      local_1bc = local_1c0;
      if ((~local_1c0 & 0x1c0) == 0) {
        local_1bc = 0;
        permissions_00 = local_1c0;
      }
      bVar2 = SetPermissions(this,destination,permissions_00);
      if (bVar2) {
        cmsys::Directory::Directory(&DStack_1e8);
        if (source->_M_string_length != 0) {
          cmsys::Directory::Load(&DStack_1e8,source);
        }
        uVar4 = cmsys::Directory::GetNumberOfFiles(&DStack_1e8);
        if (uVar4 != 0) {
          dindex = 0;
          do {
            pcVar5 = cmsys::Directory::GetFile(&DStack_1e8,dindex);
            iVar3 = strcmp(pcVar5,".");
            if (iVar3 != 0) {
              pcVar5 = cmsys::Directory::GetFile(&DStack_1e8,dindex);
              iVar3 = strcmp(pcVar5,"..");
              if (iVar3 != 0) {
                local_1a8._0_8_ = local_198;
                pcVar1 = (source->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1a8,pcVar1,pcVar1 + source->_M_string_length);
                std::__cxx11::string::append((char *)local_1a8);
                cmsys::Directory::GetFile(&DStack_1e8,dindex);
                std::__cxx11::string::append((char *)local_1a8);
                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                pcVar1 = (destination->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1e0,pcVar1,pcVar1 + destination->_M_string_length);
                std::__cxx11::string::append((char *)&local_1e0);
                cmsys::Directory::GetFile(&DStack_1e8,dindex);
                std::__cxx11::string::append((char *)&local_1e0);
                iVar3 = (*this->_vptr_cmFileCopier[2])(this,local_1a8,&local_1e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  operator_delete(local_1e0._M_dataplus._M_p,
                                  local_1e0.field_2._M_allocated_capacity + 1);
                }
                if ((_func_int **)local_1a8._0_8_ != local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
                }
                if ((char)iVar3 == '\0') {
                  bVar2 = false;
                  goto LAB_002de480;
                }
              }
            }
            dindex = dindex + 1;
          } while (uVar4 != dindex);
        }
        bVar2 = SetPermissions(this,destination,local_1bc);
LAB_002de480:
        cmsys::Directory::~Directory(&DStack_1e8);
        return bVar2;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pcVar5 = this->Name;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)&DStack_1e8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x40);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," cannot make directory \"",0x18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(destination->_M_dataplus)._M_p,
                          destination->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": ",3);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !cmSystemTools::FileIsDirectory(destination));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError();
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = source;
      fromPath += "/";
      fromPath += dir.GetFile(fileNum);
      std::string toPath = destination;
      toPath += "/";
      toPath += dir.GetFile(fileNum);
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}